

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O2

int __thiscall QButtonGroup::id(QButtonGroup *this,QAbstractButton *button)

{
  int iVar1;
  long in_FS_OFFSET;
  int local_14;
  QAbstractButton *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = -1;
  local_10 = button;
  iVar1 = QHash<QAbstractButton_*,_int>::value
                    ((QHash<QAbstractButton_*,_int> *)(*(long *)&this->field_0x8 + 0xa8),&local_10,
                     &local_14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::id(QAbstractButton *button) const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(button, -1);
}